

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateMoveResult(void)

{
  float fVar1;
  ImGuiContext *pIVar2;
  ImVec2 item_rect;
  ImVec2 delta_scroll;
  ImVec2 next_scroll;
  ImRect rect_abs;
  ImGuiNavMoveResult *result;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffff78;
  ImVec2 *in_stack_ffffffffffffff80;
  ImGuiNavMoveResult *local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  undefined1 in_stack_ffffffffffffffb7;
  ImVec2 in_stack_ffffffffffffffb8;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 in_stack_ffffffffffffffe0;
  ImGuiNavMoveResult *local_10;
  
  pIVar2 = GImGui;
  if (((GImGui->NavMoveResultLocal).ID == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
    if (GImGui->NavId == 0) {
      return;
    }
    GImGui->NavDisableHighlight = false;
    pIVar2->NavDisableMouseHover = true;
    return;
  }
  if ((GImGui->NavMoveResultLocal).ID == 0) {
    local_68 = &GImGui->NavMoveResultOther;
  }
  else {
    local_68 = &GImGui->NavMoveResultLocal;
  }
  local_10 = local_68;
  if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
      ((GImGui->NavMoveResultLocalVisibleSet).ID != 0)) &&
     ((GImGui->NavMoveResultLocalVisibleSet).ID != GImGui->NavId)) {
    local_10 = &GImGui->NavMoveResultLocalVisibleSet;
  }
  if (((local_10 != &GImGui->NavMoveResultOther) && ((GImGui->NavMoveResultOther).ID != 0)) &&
     (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
    if (local_10->DistBox <= (GImGui->NavMoveResultOther).DistBox) {
      fVar1 = (GImGui->NavMoveResultOther).DistBox;
      if (((fVar1 != local_10->DistBox) || (NAN(fVar1) || NAN(local_10->DistBox))) ||
         (local_10->DistCenter <= (GImGui->NavMoveResultOther).DistCenter)) goto LAB_0014fcd2;
    }
    local_10 = &GImGui->NavMoveResultOther;
  }
LAB_0014fcd2:
  if (GImGui->NavLayer == ImGuiNavLayer_Main) {
    item_rect = operator+(&in_stack_ffffffffffffff78->Min,(ImVec2 *)0x14fd00);
    local_30 = operator+(&in_stack_ffffffffffffff78->Min,(ImVec2 *)0x14fd1f);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffe0,(ImVec2 *)&stack0xffffffffffffffd8,&local_30);
    NavScrollToBringItemIntoView((ImGuiWindow *)in_stack_ffffffffffffffe0,(ImRect *)item_rect);
    local_38 = CalcNextScrollFromScrollTargetAndClamp
                         ((ImGuiWindow *)in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    local_40 = operator-(&in_stack_ffffffffffffff78->Min,(ImVec2 *)0x14fd7e);
    ImRect::Translate(&local_10->RectRel,&local_40);
    if ((local_10->Window->Flags & 0x1000000U) != 0) {
      in_stack_ffffffffffffff80 = &local_40;
      local_58 = operator+(&in_stack_ffffffffffffff78->Min,(ImVec2 *)0x14fdd6);
      local_60 = operator+(&in_stack_ffffffffffffff78->Min,(ImVec2 *)0x14fdeb);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffffb0,&local_58,&local_60);
      NavScrollToBringItemIntoView((ImGuiWindow *)in_stack_ffffffffffffffe0,(ImRect *)item_rect);
    }
  }
  ClearActiveID();
  pIVar2->NavWindow = local_10->Window;
  SetNavIDWithRectRel((ImGuiID)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                      (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pIVar2->NavJustMovedToId = local_10->ID;
  pIVar2->NavMoveFromClampedRefRect = false;
  return;
}

Assistant:

static void ImGui::NavUpdateMoveResult()
{
    ImGuiContext& g = *GImGui;
    if (g.NavMoveResultLocal.ID == 0 && g.NavMoveResultOther.ID == 0)
    {
        // In a situation when there is no results but NavId != 0, re-enable the Navigation highlight (because g.NavId is not considered as a possible result)
        if (g.NavId != 0)
        {
            g.NavDisableHighlight = false;
            g.NavDisableMouseHover = true;
        }
        return;
    }

    // Select which result to use
    ImGuiNavMoveResult* result = (g.NavMoveResultLocal.ID != 0) ? &g.NavMoveResultLocal : &g.NavMoveResultOther;

    // PageUp/PageDown behavior first jumps to the bottom/top mostly visible item, _otherwise_ use the result from the previous/next page.
    if (g.NavMoveRequestFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet)
        if (g.NavMoveResultLocalVisibleSet.ID != 0 && g.NavMoveResultLocalVisibleSet.ID != g.NavId)
            result = &g.NavMoveResultLocalVisibleSet;

    // Maybe entering a flattened child from the outside? In this case solve the tie using the regular scoring rules.
    if (result != &g.NavMoveResultOther && g.NavMoveResultOther.ID != 0 && g.NavMoveResultOther.Window->ParentWindow == g.NavWindow)
        if ((g.NavMoveResultOther.DistBox < result->DistBox) || (g.NavMoveResultOther.DistBox == result->DistBox && g.NavMoveResultOther.DistCenter < result->DistCenter))
            result = &g.NavMoveResultOther;
    IM_ASSERT(g.NavWindow && result->Window);

    // Scroll to keep newly navigated item fully into view.
    if (g.NavLayer == 0)
    {
        ImRect rect_abs = ImRect(result->RectRel.Min + result->Window->Pos, result->RectRel.Max + result->Window->Pos);
        NavScrollToBringItemIntoView(result->Window, rect_abs);

        // Estimate upcoming scroll so we can offset our result position so mouse position can be applied immediately after in NavUpdate()
        ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(result->Window, false);
        ImVec2 delta_scroll = result->Window->Scroll - next_scroll;
        result->RectRel.Translate(delta_scroll);

        // Also scroll parent window to keep us into view if necessary (we could/should technically recurse back the whole the parent hierarchy).
        if (result->Window->Flags & ImGuiWindowFlags_ChildWindow)
            NavScrollToBringItemIntoView(result->Window->ParentWindow, ImRect(rect_abs.Min + delta_scroll, rect_abs.Max + delta_scroll));
    }

    ClearActiveID();
    g.NavWindow = result->Window;
    SetNavIDWithRectRel(result->ID, g.NavLayer, result->RectRel);
    g.NavJustMovedToId = result->ID;
    g.NavMoveFromClampedRefRect = false;
}